

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QByteArray>::eraseLast(QGenericArrayOps<QByteArray> *this)

{
  qsizetype *pqVar1;
  
  QArrayDataPointer<char>::~QArrayDataPointer
            (&(this->super_QArrayDataPointer<QByteArray>).ptr
              [(this->super_QArrayDataPointer<QByteArray>).size + -1].d);
  pqVar1 = &(this->super_QArrayDataPointer<QByteArray>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }